

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O3

Res_Win_t * Res_WinAlloc(void)

{
  Res_Win_t *pRVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Vec_t *pVVar4;
  void *pvVar5;
  long lVar6;
  
  pRVar1 = (Res_Win_t *)calloc(1,0x58);
  pRVar1->nFanoutLimit = 10;
  pRVar1->nLevTfiMinus = 3;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 0x100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x800);
  pVVar2->pArray = ppvVar3;
  pRVar1->vRoots = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 0x100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x800);
  pVVar2->pArray = ppvVar3;
  pRVar1->vLeaves = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 0x100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x800);
  pVVar2->pArray = ppvVar3;
  pRVar1->vBranches = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 0x100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x800);
  pVVar2->pArray = ppvVar3;
  pRVar1->vNodes = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 0x100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x800);
  pVVar2->pArray = ppvVar3;
  pRVar1->vDivs = pVVar2;
  pVVar4 = (Vec_Vec_t *)malloc(0x10);
  pVVar4->nCap = 0x80;
  ppvVar3 = (void **)malloc(0x400);
  pVVar4->pArray = ppvVar3;
  lVar6 = 0;
  do {
    pvVar5 = calloc(1,0x10);
    ppvVar3[lVar6] = pvVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x80);
  pVVar4->nSize = 0x80;
  pRVar1->vMatrix = pVVar4;
  return pRVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the window.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Res_Win_t * Res_WinAlloc()
{
    Res_Win_t * p;
    // start the manager
    p = ABC_ALLOC( Res_Win_t, 1 );
    memset( p, 0, sizeof(Res_Win_t) );
    // set internal parameters
    p->nFanoutLimit = 10;
    p->nLevTfiMinus =  3;
    // allocate storage
    p->vRoots    = Vec_PtrAlloc( 256 );
    p->vLeaves   = Vec_PtrAlloc( 256 );
    p->vBranches = Vec_PtrAlloc( 256 );
    p->vNodes    = Vec_PtrAlloc( 256 );
    p->vDivs     = Vec_PtrAlloc( 256 );
    p->vMatrix   = Vec_VecStart( 128 );
    return p;
}